

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  int iVar4;
  pointer pIVar5;
  TestEventListeners *this_00;
  TimeInMillis TVar6;
  Random *this_01;
  UnitTestImpl *this_02;
  char *__s;
  undefined8 uVar7;
  TestSuite *pTVar8;
  int local_c0;
  int local_bc;
  undefined1 local_b0 [20];
  int local_9c;
  int local_98;
  int j_1;
  int test_index;
  allocator<char> local_81;
  string local_80 [32];
  string *local_60;
  string *result;
  TestPartResult *test_part_result;
  TestResult *pTStack_48;
  int j;
  TestResult *test_result;
  TimeInMillis start;
  byte local_2d;
  int i;
  bool gtest_repeat_forever;
  TestEventListener *pTStack_28;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  UnitTestImpl *pUStack_18;
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *this_local;
  
  pUStack_18 = this;
  repeater._7_1_ = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    repeater._6_1_ = 0;
    pIVar5 = std::
             unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ::get(&this->internal_run_death_test_flag_);
    repeater._6_1_ = pIVar5 != (pointer)0x0;
    repeater._5_1_ = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",(bool)repeater._6_1_);
    iVar2 = FilterTests(this,(uint)!(bool)repeater._5_1_);
    repeater._4_1_ = 0 < iVar2;
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      if ((FLAGS_gtest_shuffle & 1) == 0) {
        local_bc = 0;
      }
      else {
        local_bc = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = local_bc;
      repeater._3_1_ = 0;
      this_00 = listeners(this);
      pTStack_28 = TestEventListeners::repeater(this_00);
      TVar6 = GetTimeInMillis();
      this->start_timestamp_ = TVar6;
      (*pTStack_28->_vptr_TestEventListener[2])(pTStack_28,this->parent_);
      if ((repeater._6_1_ & 1) == 0) {
        local_c0 = FLAGS_gtest_repeat;
      }
      else {
        local_c0 = 1;
      }
      i = local_c0;
      local_2d = local_c0 < 0;
      start._4_4_ = 0;
LAB_0013c01c:
      if ((local_2d & 1) != 0 || start._4_4_ != i) {
        ClearNonAdHocTestResult(this);
        test_result = (TestResult *)GetTimeInMillis();
        if (((repeater._4_1_ & 1) != 0) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(this);
          Random::Reseed(this_01,this->random_seed_);
          ShuffleTests(this);
        }
        (*pTStack_28->_vptr_TestEventListener[3])(pTStack_28,this->parent_,(ulong)start._4_4_);
        if ((repeater._4_1_ & 1) != 0) {
          (*pTStack_28->_vptr_TestEventListener[4])(pTStack_28,this->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    (&this->environments_,SetUpEnvironment);
          (*pTStack_28->_vptr_TestEventListener[5])(pTStack_28,this->parent_);
          bVar1 = Test::IsSkipped();
          if (bVar1) {
            this_02 = GetUnitTestImpl();
            pTStack_48 = current_test_result(this_02);
            for (test_part_result._4_4_ = 0; iVar2 = test_part_result._4_4_,
                iVar4 = TestResult::total_part_count(pTStack_48), iVar2 < iVar4;
                test_part_result._4_4_ = test_part_result._4_4_ + 1) {
              result = (string *)TestResult::GetTestPartResult(pTStack_48,test_part_result._4_4_);
              TVar3 = TestPartResult::type((TestPartResult *)result);
              if (TVar3 == kSkip) {
                __s = TestPartResult::message((TestPartResult *)result);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>(local_80,__s,&local_81);
                std::allocator<char>::~allocator(&local_81);
                local_60 = local_80;
                uVar7 = std::__cxx11::string::c_str();
                printf("%s\n",uVar7);
                std::__cxx11::string::~string(local_80);
              }
            }
            fflush(_stdout);
          }
          else {
            bVar1 = Test::HasFatalFailure();
            if (!bVar1) {
              for (local_98 = 0; iVar2 = local_98, iVar4 = total_test_suite_count(this),
                  iVar2 < iVar4; local_98 = local_98 + 1) {
                pTVar8 = GetMutableSuiteCase(this,local_98);
                TestSuite::Run(pTVar8);
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  pTVar8 = GetMutableSuiteCase(this,local_98);
                  bVar1 = TestSuite::Failed(pTVar8);
                  iVar2 = local_98;
                  if (bVar1) goto LAB_0013c2d3;
                }
              }
            }
          }
          goto LAB_0013c33e;
        }
        goto LAB_0013c3b6;
      }
      (*pTStack_28->_vptr_TestEventListener[0x10])(pTStack_28,this->parent_);
      if ((repeater._7_1_ & 1) == 0) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      this_local._7_1_ = (bool)((repeater._3_1_ ^ 0xff) & 1);
    }
    else {
      ListTestsMatchingFilter(this);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
LAB_0013c2d3:
  while( true ) {
    local_9c = iVar2 + 1;
    iVar2 = local_9c;
    iVar4 = total_test_suite_count(this);
    if (iVar4 <= iVar2) break;
    pTVar8 = GetMutableSuiteCase(this,local_9c);
    TestSuite::Skip(pTVar8);
    iVar2 = local_9c;
  }
LAB_0013c33e:
  (*pTStack_28->_vptr_TestEventListener[0xd])(pTStack_28,this->parent_);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             (local_b0 + 8));
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)local_b0);
  __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)(local_b0 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)local_b0,TearDownEnvironment);
  (*pTStack_28->_vptr_TestEventListener[0xe])(pTStack_28,this->parent_);
LAB_0013c3b6:
  TVar6 = GetTimeInMillis();
  this->elapsed_time_ = TVar6 - (long)test_result;
  (*pTStack_28->_vptr_TestEventListener[0xf])(pTStack_28,this->parent_,(ulong)start._4_4_);
  bVar1 = Passed(this);
  if (!bVar1) {
    repeater._3_1_ = 1;
  }
  UnshuffleTests(this);
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar2 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar2;
  }
  start._4_4_ = start._4_4_ + 1;
  goto LAB_0013c01c;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}